

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

__int128 * __thiscall
calculator::ExpressionParser<__int128>::calculate
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this,__int128 v1,__int128 v2
          ,Operator *op)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  ulong uVar1;
  long extraout_RAX;
  __int128 *p_Var2;
  __int128 *extraout_RAX_00;
  ExpressionParser<__int128> *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 unaff_RBX;
  int *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  uVar1 = CONCAT44(0,*in_R9 - 1);
  switch(uVar1) {
  case 0:
    p_Var2 = (__int128 *)((ulong)in_RCX | (ulong)this);
    break;
  case 1:
    p_Var2 = (__int128 *)((ulong)in_RCX ^ (ulong)this);
    break;
  case 2:
    p_Var2 = (__int128 *)((ulong)in_RCX & (ulong)this);
    break;
  case 3:
    p_Var2 = (__int128 *)__ashlti3(this,op,(ulong)in_RCX & 0xff);
    break;
  case 4:
    p_Var2 = (__int128 *)__ashrti3(this,op,(ulong)in_RCX & 0xff);
    break;
  case 5:
    p_Var2 = (__int128 *)
             ((long)&(this->expr_)._M_dataplus._M_p + (long)&(in_RCX->expr_)._M_dataplus._M_p);
    break;
  case 6:
    p_Var2 = (__int128 *)((long)this - (long)in_RCX);
    break;
  case 7:
    p_Var2 = (__int128 *)((long)in_RCX * (long)this);
    break;
  case 8:
    value_00._8_8_ = unaff_RBX;
    value_00._0_8_ = uVar1;
    p_Var2 = checkZero(__return_storage_ptr__,in_RCX,(__int128)value_00);
    p_Var2 = (__int128 *)__divti3(this,op,p_Var2,extraout_RDX_00);
    break;
  case 9:
    value._8_8_ = unaff_RBX;
    value._0_8_ = uVar1;
    p_Var2 = checkZero(__return_storage_ptr__,in_RCX,(__int128)value);
    p_Var2 = (__int128 *)__modti3(this,op,p_Var2,extraout_RDX);
    break;
  case 10:
    pow(in_XMM0_Qa,in_XMM1_Qa);
    p_Var2 = extraout_RAX_00;
    break;
  case 0xb:
    pow(in_XMM0_Qa,in_XMM1_Qa);
    p_Var2 = (__int128 *)(extraout_RAX * (long)this);
    break;
  default:
    p_Var2 = (__int128 *)0x0;
  }
  return p_Var2;
}

Assistant:

T calculate(T v1, T v2, const Operator& op) const
  {
    switch (op.op)
    {
      case OPERATOR_BITWISE_OR:     return v1 | v2;
      case OPERATOR_BITWISE_XOR:    return v1 ^ v2;
      case OPERATOR_BITWISE_AND:    return v1 & v2;
      case OPERATOR_BITWISE_SHL:    return v1 << v2;
      case OPERATOR_BITWISE_SHR:    return v1 >> v2;
      case OPERATOR_ADDITION:       return v1 + v2;
      case OPERATOR_SUBTRACTION:    return v1 - v2;
      case OPERATOR_MULTIPLICATION: return v1 * v2;
      case OPERATOR_DIVISION:       return v1 / checkZero(v2);
      case OPERATOR_MODULO:         return v1 % checkZero(v2);
      case OPERATOR_POWER:          return pow(v1, v2);
      case OPERATOR_EXPONENT:       return v1 * pow(10, v2);
      default:                      return 0;
    }
  }